

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O0

Spot * spot_dup(Spot *spot)

{
  Spot *pSVar1;
  Card **ppCVar2;
  Card *pCVar3;
  long in_RDI;
  Spot *dupSpot;
  uchar i;
  undefined6 in_stack_fffffffffffffff0;
  uchar in_stack_fffffffffffffff6;
  SPOTTYPE in_stack_fffffffffffffff7;
  byte bVar4;
  
  pSVar1 = spot_create(in_stack_fffffffffffffff7,in_stack_fffffffffffffff6);
  ppCVar2 = (Card **)malloc((ulong)*(byte *)(in_RDI + 2) << 3);
  pSVar1->cards = ppCVar2;
  pSVar1->cardsCount = *(uchar *)(in_RDI + 2);
  for (bVar4 = 0; bVar4 < *(byte *)(in_RDI + 2); bVar4 = bVar4 + 1) {
    pCVar3 = card_dup((Card *)CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffff6,
                                                      in_stack_fffffffffffffff0)));
    pSVar1->cards[bVar4] = pCVar3;
  }
  return pSVar1;
}

Assistant:

Spot * spot_dup(Spot * spot)
{
	unsigned char i;
	Spot * dupSpot = spot_create(spot->type, spot->index);
	dupSpot->cards = (Card **)malloc(sizeof(Card *)*spot->cardsCount);
	dupSpot->cardsCount = spot->cardsCount;
	for(i=0;i<spot->cardsCount;i++)
	{
		dupSpot->cards[i] = card_dup(spot->cards[i]);
	}
	return dupSpot;
}